

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void std::
     __insertion_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
               (iterator __first,iterator __last,
               _Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
               __comp)

{
  int iVar1;
  QTableWidgetItem *pQVar2;
  bool bVar3;
  iterator __last_00;
  
  if (__first.i != __last.i) {
    for (__last_00.i = __first.i + 1; __last_00.i != __last.i; __last_00.i = __last_00.i + 1) {
      bVar3 = (*__comp._M_comp)(__last_00.i,__first.i);
      if (bVar3) {
        pQVar2 = (__last_00.i)->first;
        iVar1 = (__last_00.i)->second;
        __copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<QList<std::pair<QTableWidgetItem*,int>>::iterator,QList<std::pair<QTableWidgetItem*,int>>::iterator>
                  (__first,__last_00,__last_00.i + 1);
        (__first.i)->first = pQVar2;
        (__first.i)->second = iVar1;
      }
      else {
        __unguarded_linear_insert<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Val_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
                  (__last_00,
                   (_Val_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
                    )__comp._M_comp);
      }
    }
  }
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }